

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O3

void CorUnix::CSharedMemoryObject::FreeSharedDataAreas(SHMPTR shmObjData)

{
  LPVOID pvVar1;
  
  if (shmObjData == 0) {
    fprintf(_stderr,"] %s %s:%d","FreeSharedDataAreas",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x1a0);
    fprintf(_stderr,"Expression: SHMNULL != shmObjData\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    SHMLock();
    pvVar1 = SHMPtrToPtr(shmObjData);
    if (pvVar1 == (LPVOID)0x0) {
      fprintf(_stderr,"] %s %s:%d","FreeSharedDataAreas",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
              ,0x1aa);
      fprintf(_stderr,"Expression: NULL != psmod\n");
    }
    if (*(SHMPTR *)((long)pvVar1 + 0x20) != 0) {
      SHMfree(*(SHMPTR *)((long)pvVar1 + 0x20));
    }
    if (*(SHMPTR *)((long)pvVar1 + 0x28) != 0) {
      SHMfree(*(SHMPTR *)((long)pvVar1 + 0x28));
    }
    if (*(SHMPTR *)((long)pvVar1 + 0x18) != 0) {
      SHMfree(*(SHMPTR *)((long)pvVar1 + 0x18));
    }
    SHMfree(shmObjData);
    SHMRelease();
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

void
CSharedMemoryObject::FreeSharedDataAreas(
    SHMPTR shmObjData
    )
{
    SHMObjData *psmod;

    _ASSERTE(SHMNULL != shmObjData);

    ENTRY("CSharedMemoryObject::FreeSharedDataAreas"
        "(shmObjData = %p)\n",
        shmObjData
        );

    SHMLock();
        
    psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, shmObjData);
    _ASSERTE(NULL != psmod);
    
    if (SHMNULL != psmod->shmObjImmutableData)
    {
        SHMfree(psmod->shmObjImmutableData);
    }

    if (SHMNULL != psmod->shmObjSharedData)
    {
        SHMfree(psmod->shmObjSharedData);
    }

    if (SHMNULL != psmod->shmObjName)
    {
        SHMfree(psmod->shmObjName);
    }
    
    SHMfree(shmObjData);

    SHMRelease();

    LOGEXIT("CSharedMemoryObject::FreeSharedDataAreas\n");
}